

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

void __thiscall
QLocalServerPrivate::waitForNewConnection(QLocalServerPrivate *this,int msec,bool *timedOut)

{
  QLatin1StringView latin1;
  int iVar1;
  int *piVar2;
  undefined1 *in_RDX;
  int in_ESI;
  QLocalServerPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  pollfd pfd;
  TimerType TVar4;
  undefined4 in_stack_ffffffffffffffb8;
  QLocalServerPrivate *this_00;
  char *in_stack_ffffffffffffffc8;
  QDeadlineTimer local_20;
  pollfd local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.fd = -0x55555556;
  local_10.events = -0x5556;
  local_10.revents = -0x5556;
  TVar4 = CoarseTimer;
  this_00 = in_RDI;
  local_10 = qt_make_pollfd((int)((ulong)in_RDI >> 0x20),(short)((ulong)in_RDI >> 0x10));
  QDeadlineTimer::QDeadlineTimer(&local_20,(long)in_ESI,TVar4);
  iVar1 = qt_safe_poll(&local_10,1,(QDeadlineTimer *)local_20.t1);
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      if (in_RDX != (undefined1 *)0x0) {
        *in_RDX = 1;
      }
      goto LAB_00385fae;
    }
    if (((ulong)local_10 & 0x20000000000000) == 0) {
      _q_onNewConnection((QLocalServerPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
      goto LAB_00385fae;
    }
    piVar2 = __errno_location();
    *piVar2 = 9;
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)CONCAT44(iVar1,TVar4),(size_t)in_RDI)
  ;
  latin1.m_data = in_stack_ffffffffffffffc8;
  latin1.m_size = (qsizetype)this_00;
  QString::QString((QString *)QVar3.m_size,latin1);
  setError(this_00,(QString *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  QString::~QString((QString *)0x385fa4);
  closeServer(in_RDI);
LAB_00385fae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalServerPrivate::waitForNewConnection(int msec, bool *timedOut)
{
    pollfd pfd = qt_make_pollfd(listenSocket, POLLIN);
    switch (qt_safe_poll(&pfd, 1, QDeadlineTimer(msec))) {
    case 0:
        if (timedOut)
            *timedOut = true;

        return;
        break;
    default:
        if ((pfd.revents & POLLNVAL) == 0) {
            _q_onNewConnection();
            return;
        }

        errno = EBADF;
        Q_FALLTHROUGH();
    case -1:
        setError("QLocalServer::waitForNewConnection"_L1);
        closeServer();
        break;
    }
}